

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O2

bool __thiscall
ConsistencyChecker::checkVarnodeTruncation
          (ConsistencyChecker *this,Constructor *ct,int4 slot,OpTpl *op,VarnodeTpl *vn,
          bool isbigendian)

{
  char cVar1;
  int4 iVar2;
  bool bVar3;
  allocator local_59;
  OpTpl *local_58;
  string local_50;
  
  bVar3 = true;
  if ((*(int *)(vn + 0x20) == 1) && (*(int *)(vn + 0x38) == 3)) {
    local_58 = op;
    if (*(uint *)(vn + 0x40) < 2) {
      iVar2 = recoverSize(this,(ConstTpl *)(vn + 0x20),ct);
      if (iVar2 < 1) {
        std::__cxx11::string::string((string *)&local_50,"Could not recover size",&local_59);
        printOpError(this,local_58,ct,slot,slot,&local_50);
      }
      else {
        cVar1 = VarnodeTpl::adjustTruncation((int)vn,SUB41(iVar2,0));
        if (cVar1 != '\0') {
          return true;
        }
        std::__cxx11::string::string
                  ((string *)&local_50,"Truncation operator out of bounds",&local_59);
        printOpError(this,local_58,ct,slot,slot,&local_50);
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_50,"Bad truncation expression",&local_59);
      printOpError(this,local_58,ct,slot,slot,&local_50);
    }
    std::__cxx11::string::~string((string *)&local_50);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ConsistencyChecker::checkVarnodeTruncation(Constructor *ct,int4 slot,
						OpTpl *op,VarnodeTpl *vn,bool isbigendian)
{
  const ConstTpl &off( vn->getOffset() );
  if (off.getType() != ConstTpl::handle) return true;
  if (off.getSelect() != ConstTpl::v_offset_plus) return true;
  ConstTpl::const_type sztype = vn->getSize().getType();
  if ((sztype != ConstTpl::real)&&(sztype != ConstTpl::handle)) {
    printOpError(op,ct,slot,slot,"Bad truncation expression");
    return false;
  }
  int4 sz = recoverSize(off,ct); // Recover the size of the original operand
  if (sz <= 0) {
    printOpError(op,ct,slot,slot,"Could not recover size");
    return false;
  }
  bool res = vn->adjustTruncation(sz,isbigendian);
  if (!res) {
    printOpError(op,ct,slot,slot,"Truncation operator out of bounds");
    return false;
  }
  return true;
}